

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
::destroy(SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
          *this)

{
  SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
  *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,capnp::tryReadMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }